

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

ssize_t __thiscall Process::read(Process *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  ssize_t sVar4;
  uint uVar5;
  undefined4 in_register_00000034;
  int iVar6;
  undefined4 uVar7;
  int iVar8;
  fd_set fdr;
  timeval tv;
  fd_set local_c8;
  timeval local_48;
  
  local_c8.fds_bits[0xe] = 0;
  local_c8.fds_bits[0xf] = 0;
  local_c8.fds_bits[0xc] = 0;
  local_c8.fds_bits[0xd] = 0;
  local_c8.fds_bits[10] = 0;
  local_c8.fds_bits[0xb] = 0;
  local_c8.fds_bits[8] = 0;
  local_c8.fds_bits[9] = 0;
  local_c8.fds_bits[6] = 0;
  local_c8.fds_bits[7] = 0;
  local_c8.fds_bits[4] = 0;
  local_c8.fds_bits[5] = 0;
  local_c8.fds_bits[2] = 0;
  local_c8.fds_bits[3] = 0;
  local_c8.fds_bits[0] = 0;
  local_c8.fds_bits[1] = 0;
  uVar1 = *(uint *)__nbytes;
  iVar2 = 0;
  if (((uVar1 & 1) != 0) && (iVar8 = this->fdStdOutRead, iVar2 = 0, iVar8 != 0)) {
    iVar2 = iVar8 + 0x3f;
    if (-1 < iVar8) {
      iVar2 = iVar8;
    }
    local_c8.fds_bits[iVar2 >> 6] =
         local_c8.fds_bits[iVar2 >> 6] | 1L << ((byte)(iVar8 % 0x40) & 0x3f);
    iVar2 = iVar8;
  }
  if (((uVar1 & 2) == 0) || (iVar8 = this->fdStdErrRead, iVar8 == 0)) {
LAB_00103ef6:
    iVar8 = iVar2;
    if (iVar2 == 0) {
      piVar3 = __errno_location();
      *piVar3 = 0x16;
      return -1;
    }
  }
  else {
    iVar6 = iVar8 + 0x3f;
    if (-1 < iVar8) {
      iVar6 = iVar8;
    }
    local_c8.fds_bits[iVar6 >> 6] = local_c8.fds_bits[iVar6 >> 6] | 1L << ((byte)iVar8 & 0x3f);
    if (iVar8 <= iVar2) goto LAB_00103ef6;
  }
  local_48.tv_sec = 1000;
  local_48.tv_usec = 0;
  while( true ) {
    do {
      iVar2 = select(iVar8 + 1,&local_c8,(fd_set *)0x0,(fd_set *)0x0,&local_48);
    } while (iVar2 == 0);
    if (iVar2 != -1) break;
    piVar3 = __errno_location();
    if (*piVar3 != 4) {
      return -1;
    }
  }
  if ((*(uint *)__nbytes & 1) != 0) {
    uVar1 = this->fdStdOutRead;
    if (uVar1 != 0) {
      uVar5 = uVar1 + 0x3f;
      if (-1 < (int)uVar1) {
        uVar5 = uVar1;
      }
      uVar7 = 1;
      if (((ulong)local_c8.fds_bits[(int)uVar5 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0)
      goto LAB_00103fb3;
    }
  }
  if ((*(uint *)__nbytes & 2) == 0) {
    return -1;
  }
  uVar1 = this->fdStdErrRead;
  if (uVar1 == 0) {
    return -1;
  }
  uVar5 = uVar1 + 0x3f;
  if (-1 < (int)uVar1) {
    uVar5 = uVar1;
  }
  if (((ulong)local_c8.fds_bits[(int)uVar5 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
    return -1;
  }
  this = (Process *)&this->fdStdErrRead;
  uVar7 = 2;
LAB_00103fb3:
  *(undefined4 *)__nbytes = uVar7;
  sVar4 = ::read(this->fdStdOutRead,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
  return sVar4;
}

Assistant:

ssize Process::read(void* buffer, usize length, uint& streams)
{
#ifdef _WIN32
  HANDLE handles[2];
  DWORD handleCount = 0;
  if(streams & stdoutStream && hStdOutRead != INVALID_HANDLE_VALUE)
    handles[handleCount++] = hStdOutRead;
  if(streams & stderrStream && hStdErrRead != INVALID_HANDLE_VALUE)
    handles[handleCount++] = hStdErrRead;
  if(handleCount == 0)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return -1;
  }
  DWORD dw = WaitForMultipleObjects(handleCount, handles, FALSE, INFINITE);
  if(dw < WAIT_OBJECT_0 || dw >= WAIT_OBJECT_0 + handleCount)
    return -1;
  HANDLE readHandle = handles[dw - WAIT_OBJECT_0];
  streams = readHandle == hStdOutRead ? stdoutStream : stderrStream;
  DWORD i;
#ifdef _AMD64
  byte* bufferStart = (byte*)buffer;
  while(length > (usize)INT_MAX)
  {
    if(!ReadFile(readHandle, buffer, INT_MAX, &i, NULL))
    {
      if(GetLastError() == ERROR_BROKEN_PIPE)
        return (byte*)buffer - bufferStart;
      return -1;
    }
    buffer = (byte*)buffer + i;
    if(i != INT_MAX)
      return (byte*)buffer - bufferStart;
    length -= INT_MAX;
  }
  if(!ReadFile(readHandle, buffer, (DWORD)length, &i, NULL))
  {
    if(GetLastError() == ERROR_BROKEN_PIPE)
      return (byte*)buffer - bufferStart;
    return -1;
  }
  buffer = (byte*)buffer + i;
  return (byte*)buffer - bufferStart;
#else
  if(!ReadFile(readHandle, buffer, length, &i, NULL))
    return -1;
  return i;
#endif
#else
  fd_set fdr;
  FD_ZERO(&fdr);
  int maxFd = 0;
  if(streams & stdoutStream && fdStdOutRead)
  {
    FD_SET(fdStdOutRead, &fdr);
    maxFd = fdStdOutRead;
  }
  if(streams & stderrStream && fdStdErrRead)
  {
    FD_SET(fdStdErrRead, &fdr);
    if(fdStdErrRead > maxFd)
      maxFd = fdStdErrRead;
  }
  if(maxFd == 0)
  {
    errno = EINVAL;
    return -1;
  }
  timeval tv = {1000, 0};
  for(;;)
  {
    int i = select(maxFd + 1, &fdr, 0, 0, &tv);
    if(i == 0)
      continue;
    if(i == -1)
    {
      if (errno == EINTR)
        continue;
      return -1;
    }
    break;
  }
  if(streams & stdoutStream && fdStdOutRead && FD_ISSET(fdStdOutRead, &fdr))
  {
    streams = stdoutStream;
    return ::read(fdStdOutRead, buffer, length);
  }
  if(streams & stderrStream && fdStdErrRead && FD_ISSET(fdStdErrRead, &fdr))
  {
    streams = stderrStream;
    return ::read(fdStdErrRead, buffer, length);
  }
  return -1;
#endif
}